

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

CopyablePtr<perfetto::protos::gen::IPCFrame_BindService> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::IPCFrame_BindService>::operator=
          (CopyablePtr<perfetto::protos::gen::IPCFrame_BindService> *this,
          CopyablePtr<perfetto::protos::gen::IPCFrame_BindService> *other)

{
  IPCFrame_BindService *this_00;
  CopyablePtr<perfetto::protos::gen::IPCFrame_BindService> *other_local;
  CopyablePtr<perfetto::protos::gen::IPCFrame_BindService> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::IPCFrame_BindService,_std::default_delete<perfetto::protos::gen::IPCFrame_BindService>_>
  ::operator=(&this->ptr_,&other->ptr_);
  this_00 = (IPCFrame_BindService *)operator_new(0x50);
  perfetto::protos::gen::IPCFrame_BindService::IPCFrame_BindService(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::IPCFrame_BindService,_std::default_delete<perfetto::protos::gen::IPCFrame_BindService>_>
  ::reset(&other->ptr_,this_00);
  return this;
}

Assistant:

CopyablePtr& operator=(CopyablePtr&& other) {
    ptr_ = std::move(other.ptr_);
    other.ptr_.reset(new T());
    return *this;
  }